

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O1

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>
           *this,long *state,long *next)

{
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  difference_type __d;
  uint uVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  
  uVar2 = *(undefined8 *)(this + 0x30);
  lVar3 = *state;
  uVar1 = *(uint *)(this + 0x2c);
  if (uVar1 == 0) {
    uVar12 = 0;
  }
  else {
    uVar11 = 0;
    do {
      pcVar9 = *(char **)this;
      pcVar4 = *(char **)(this + 0x20);
      bVar14 = pcVar9 == pcVar4;
      if (!bVar14) {
        pcVar5 = (char *)*state;
        bVar14 = false;
        pcVar10 = pcVar5;
        do {
          if (pcVar10 == (char *)state[4]) {
            *(undefined1 *)((long)state + 0x31) = 1;
LAB_00130b24:
            *state = (long)pcVar5;
            break;
          }
          if (*pcVar10 != *pcVar9) goto LAB_00130b24;
          pcVar9 = pcVar9 + 1;
          pcVar10 = pcVar10 + 1;
          *state = (long)pcVar10;
          bVar14 = pcVar9 == pcVar4;
        } while (!bVar14);
      }
      uVar12 = uVar11;
    } while ((bVar14) && (uVar11 = uVar11 + 1, uVar12 = uVar1, uVar11 != uVar1));
  }
  if (this[0x38] ==
      (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>
       )0x1) {
    lVar7 = (ulong)(state[4] != lVar3) + lVar3;
    lVar8 = lVar7;
    if (uVar12 < *(uint *)(this + 0x2c)) {
      lVar8 = *state;
    }
    if (uVar12 != 0) {
      lVar7 = lVar8;
    }
    state[0x12] = lVar7;
  }
  if (uVar12 < *(uint *)(this + 0x28)) {
LAB_00130b74:
    *state = lVar3;
    bVar14 = false;
  }
  else {
    cVar6 = (**(code **)(*next + 0x10))(next,state);
    bVar14 = true;
    if (cVar6 == '\0') {
      iVar13 = uVar12 + 1;
      do {
        iVar13 = iVar13 + -1;
        if (iVar13 == *(int *)(this + 0x28)) goto LAB_00130b74;
        *state = *state + (long)-(int)uVar2;
        cVar6 = (**(code **)(*next + 0x10))(next,state);
      } while (cVar6 == '\0');
    }
  }
  return bVar14;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }